

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shop.cpp
# Opt level: O3

void __thiscall SHOPManagement::Shop::saveAddress(Shop *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Address *this_00;
  int iVar2;
  pointer ppUVar3;
  long lVar4;
  ostream *poVar5;
  undefined8 *puVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  stringstream ss;
  string local_208;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  pointer local_1d0;
  pointer local_1c8;
  undefined8 *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [8];
  string local_1a0 [104];
  ios_base local_138 [264];
  
  local_1e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::stringstream::stringstream(local_1b8);
  ppUVar3 = (this->v_users).
            super__Vector_base<SHOPManagement::User_*,_std::allocator<SHOPManagement::User_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_1d0 = (this->v_users).
              super__Vector_base<SHOPManagement::User_*,_std::allocator<SHOPManagement::User_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  if (ppUVar3 != local_1d0) {
    paVar1 = &local_208.field_2;
    do {
      local_1c8 = ppUVar3;
      lVar4 = __dynamic_cast(*ppUVar3,&User::typeinfo,&Person::typeinfo,0);
      puVar6 = *(undefined8 **)(lVar4 + 0xb0);
      local_1c0 = *(undefined8 **)(lVar4 + 0xb8);
      if (puVar6 != local_1c0) {
        do {
          this_00 = (Address *)*puVar6;
          iVar2 = Address::getPid(this_00);
          poVar5 = (ostream *)std::ostream::operator<<(local_1a8,iVar2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"|",1);
          Address::getName_abi_cxx11_(&local_208,this_00);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"|",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != paVar1) {
            operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
          }
          Address::getCountry_abi_cxx11_(&local_208,this_00);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"|",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != paVar1) {
            operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
          }
          Address::getCity_abi_cxx11_(&local_208,this_00);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"|",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != paVar1) {
            operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
          }
          Address::getStreet_abi_cxx11_(&local_208,this_00);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != paVar1) {
            operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::stringbuf::str();
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1e8
                     ,&local_208);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != paVar1) {
            operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
          }
          local_208._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"");
          std::__cxx11::stringbuf::str(local_1a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != paVar1) {
            operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
          }
          puVar6 = puVar6 + 1;
        } while (puVar6 != local_1c0);
      }
      ppUVar3 = local_1c8 + 1;
    } while (ppUVar3 != local_1d0);
  }
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"data/ADDRESSES.dat","");
  Helper::saveFileByLine(&local_208,&local_1e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1e8);
  return;
}

Assistant:

void Shop::saveAddress()
    {
        std::vector<std::string> lines;
        std::stringstream ss;

        for (auto current : this->v_users)
        {
            Person *pPerson = dynamic_cast<Person *>(current);

            for (auto current_address : pPerson->v_adress_list)
            {
                ss << current_address->getPid() << "|";
                ss << current_address->getName() << "|";
                ss << current_address->getCountry() << "|";
                ss << current_address->getCity() << "|";
                ss << current_address->getStreet();
                lines.push_back(ss.str());
                ss.str("");
            }
        }

        Helper::saveFileByLine("data/ADDRESSES.dat", lines);
    }